

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O1

bool __thiscall Corrade::Utility::Configuration::parse(Configuration *this,StringView in)

{
  byte *pbVar1;
  char *pcVar2;
  Debug *this_00;
  ostream *output;
  pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*> parsed;
  StringView local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  Error local_58;
  pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*> local_30;
  
  local_78 = in;
  if (2 < (in._sizePlusFlags & 0x3fffffffffffffff)) {
    pcVar2 = Containers::BasicStringView<const_char>::operator[](&local_78,0);
    if (*pcVar2 == -0x11) {
      pcVar2 = Containers::BasicStringView<const_char>::operator[](&local_78,1);
      if (*pcVar2 == -0x45) {
        pcVar2 = Containers::BasicStringView<const_char>::operator[](&local_78,2);
        if (*pcVar2 == -0x41) {
          pbVar1 = (byte *)((long)&(this->_flags)._value + 2);
          *pbVar1 = *pbVar1 | 2;
          local_78 = Containers::BasicStringView<const_char>::slice
                               (&local_78,3,local_78._sizePlusFlags & 0x3fffffffffffffff);
        }
      }
    }
  }
  local_68 = 0;
  uStack_60 = 0x8000000000000000;
  parse(&local_30,this,local_78,&this->super_ConfigurationGroup,
        (StringView)(ZEXT816(0x8000000000000000) << 0x40));
  if (local_30.second == (char *)0x0) {
    if ((local_30.first._sizePlusFlags & 0x3fffffffffffffff) != 0) {
      output = Error::defaultOutput();
      Error::Error(&local_58,output,(Flags)0x0);
      Debug::operator<<(&local_58.super_Debug,
                        "Assertion parsed.first.isEmpty() failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Configuration.cpp:120"
                       );
      Error::~Error(&local_58);
      abort();
    }
  }
  else {
    Error::Error(&local_58,(Flags)0x0);
    this_00 = Debug::operator<<(&local_58.super_Debug,"Utility::Configuration::Configuration():");
    Debug::operator<<(this_00,local_30.second);
    Error::~Error(&local_58);
    ConfigurationGroup::clear(&this->super_ConfigurationGroup);
  }
  return local_30.second == (char *)0x0;
}

Assistant:

bool Configuration::parse(Containers::StringView in) {
    /* Oh, BOM, eww */
    if(in.size() >= 3 && in[0] == Bom[0] && in[1] == Bom[1] && in[2] == Bom[2]) {
        _flags |= InternalFlag::HasBom;
        in = in.exceptPrefix(3);
    }

    /* Parse file */
    std::pair<Containers::StringView, const char*> parsed = parse(in, this, {});
    if(parsed.second) {
        Error() << "Utility::Configuration::Configuration():" << parsed.second;
        clear();
        return false;
    }

    CORRADE_INTERNAL_ASSERT(parsed.first.isEmpty());
    return true;
}